

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

JsonArrayWriter * __thiscall Catch::JsonReporter::startArray(JsonReporter *this,StringRef key)

{
  _Elt_pointer pJVar1;
  _Elt_pointer pJVar2;
  char local_1c1;
  JsonArrayWriter local_1c0;
  undefined1 local_1a8 [136];
  ios_base local_120 [264];
  uint64_t local_18;
  
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)pJVar2 + -0x18,key.m_start,key.m_size);
  local_1c0.m_indent_level = local_18;
  local_1c0.m_should_comma = false;
  local_1c0.m_active = true;
  local_1c1 = '[';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),&local_1c1,1);
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::
  emplace_back<Catch::JsonArrayWriter>(&(this->m_arrayWriters).c,&local_1c0);
  JsonArrayWriter::~JsonArrayWriter(&local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_120);
  local_1a8._0_4_ = Array;
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  emplace_back<Catch::JsonReporter::Writer>(&(this->m_writers).c,(Writer *)local_1a8);
  pJVar1 = (this->m_arrayWriters).c.
           super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_arrayWriters).c.
                super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_arrayWriters).c.
             super__Deque_base<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  return pJVar1 + -1;
}

Assistant:

JsonArrayWriter& JsonReporter::startArray( StringRef key ) {
        m_arrayWriters.emplace(
            m_objectWriters.top().write( key ).writeArray() );
        m_writers.emplace( Writer::Array );
        return m_arrayWriters.top();
    }